

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

void setpath(lua_State *L,char *fieldname,char *envname,char *dft)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  luaL_Buffer b;
  luaL_Buffer local_450;
  
  pcVar2 = lua_pushfstring(L,"%s%s");
  pcVar2 = getenv(pcVar2);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = getenv(envname);
    if (pcVar2 != (char *)0x0) goto LAB_00112095;
  }
  else {
LAB_00112095:
    lua_getfield(L,-0xf4628,"LUA_NOENV");
    iVar1 = lua_toboolean(L,-1);
    lua_settop(L,-2);
    if (iVar1 == 0) {
      pcVar4 = strstr(pcVar2,";;");
      if (pcVar4 == (char *)0x0) {
        lua_pushstring(L,pcVar2);
      }
      else {
        sVar3 = strlen(pcVar2);
        luaL_buffinit(L,&local_450);
        if (pcVar2 < pcVar4) {
          luaL_addlstring(&local_450,pcVar2,(long)pcVar4 - (long)pcVar2);
          if (local_450.size <= local_450.n) {
            luaL_prepbuffsize(&local_450,1);
          }
          local_450.b[local_450.n] = ';';
          local_450.n = local_450.n + 1;
        }
        luaL_addstring(&local_450,dft);
        if (pcVar4 < pcVar2 + (sVar3 - 2)) {
          if (local_450.size <= local_450.n) {
            luaL_prepbuffsize(&local_450,1);
          }
          local_450.b[local_450.n] = ';';
          local_450.n = local_450.n + 1;
          luaL_addlstring(&local_450,pcVar4 + 2,(long)(pcVar2 + (sVar3 - 2)) - (long)pcVar4);
        }
        luaL_pushresult(&local_450);
      }
      goto LAB_001121ee;
    }
  }
  sVar3 = strlen(dft);
  lua_pushexternalstring(L,dft,sVar3,(lua_Alloc)0x0,(void *)0x0);
LAB_001121ee:
  lua_setfield(L,-3,fieldname);
  lua_settop(L,-2);
  return;
}

Assistant:

static void setpath (lua_State *L, const char *fieldname,
                                   const char *envname,
                                   const char *dft) {
  const char *dftmark;
  const char *nver = lua_pushfstring(L, "%s%s", envname, LUA_VERSUFFIX);
  const char *path = getenv(nver);  /* try versioned name */
  if (path == NULL)  /* no versioned environment variable? */
    path = getenv(envname);  /* try unversioned name */
  if (path == NULL || noenv(L))  /* no environment variable? */
    lua_pushexternalstring(L, dft, strlen(dft), NULL, NULL);  /* use default */
  else if ((dftmark = strstr(path, LUA_PATH_SEP LUA_PATH_SEP)) == NULL)
    lua_pushstring(L, path);  /* nothing to change */
  else {  /* path contains a ";;": insert default path in its place */
    size_t len = strlen(path);
    luaL_Buffer b;
    luaL_buffinit(L, &b);
    if (path < dftmark) {  /* is there a prefix before ';;'? */
      luaL_addlstring(&b, path, ct_diff2sz(dftmark - path));  /* add it */
      luaL_addchar(&b, *LUA_PATH_SEP);
    }
    luaL_addstring(&b, dft);  /* add default */
    if (dftmark < path + len - 2) {  /* is there a suffix after ';;'? */
      luaL_addchar(&b, *LUA_PATH_SEP);
      luaL_addlstring(&b, dftmark + 2, ct_diff2sz((path + len - 2) - dftmark));
    }
    luaL_pushresult(&b);
  }
  setprogdir(L);
  lua_setfield(L, -3, fieldname);  /* package[fieldname] = path value */
  lua_pop(L, 1);  /* pop versioned variable name ('nver') */
}